

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhosttx.cpp
# Opt level: O0

int __thiscall CVmHostIfcText::add_resfile(CVmHostIfcText *this,char *fname)

{
  long lVar1;
  void *pvVar2;
  char *pcVar3;
  char *in_RSI;
  long in_RDI;
  
  if (*(long *)(in_RDI + 0x18) == *(long *)(in_RDI + 0x20)) {
    *(long *)(in_RDI + 0x20) = *(long *)(in_RDI + 0x20) + 10;
    pvVar2 = realloc(*(void **)(in_RDI + 0x10),*(long *)(in_RDI + 0x20) << 3);
    *(void **)(in_RDI + 0x10) = pvVar2;
  }
  pcVar3 = lib_copy_str(in_RSI);
  lVar1 = *(long *)(in_RDI + 0x18);
  *(long *)(in_RDI + 0x18) = lVar1 + 1;
  *(char **)(*(long *)(in_RDI + 0x10) + lVar1 * 8) = pcVar3;
  return (int)*(undefined8 *)(in_RDI + 0x18) + -1;
}

Assistant:

int CVmHostIfcText::add_resfile(const char *fname)
{
    /* expand the resource file list if necessary */
    if (ext_cnt_ == ext_max_)
    {
        /* bump up the maximum a bit */
        ext_max_ += 10;

        /* reallocate the entry pointer array */
        ext_ = (char **)t3realloc(ext_, ext_max_ * sizeof(ext_[0]));
    }

    /* store the new entry */
    ext_[ext_cnt_++] = lib_copy_str(fname);

    /* 
     *   return the new entry's file number (we've already bumped the index,
     *   so it's the current count minus one) 
     */
    return ext_cnt_ - 1;
}